

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

bool __thiscall cmMakefile::PlatformIs32Bit(cmMakefile *this)

{
  bool bVar1;
  int iVar2;
  string *__lhs;
  char *__nptr;
  allocator<char> local_81;
  string local_80;
  cmValue local_60;
  cmValue sizeof_dptr;
  allocator<char> local_41;
  string local_40;
  cmValue local_20;
  cmValue plat_abi;
  cmMakefile *this_local;
  
  plat_abi.Value = (string *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"CMAKE_INTERNAL_PLATFORM_ABI",&local_41);
  local_20 = GetDefinition(this,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  bVar1 = cmValue::operator_cast_to_bool(&local_20);
  if (bVar1) {
    __lhs = cmValue::operator*[abi_cxx11_(&local_20);
    bVar1 = std::operator==(__lhs,"ELF X32");
    if (bVar1) {
      return false;
    }
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_80,"CMAKE_SIZEOF_VOID_P",&local_81);
  local_60 = GetDefinition(this,&local_80);
  std::__cxx11::string::~string((string *)&local_80);
  std::allocator<char>::~allocator(&local_81);
  bVar1 = cmValue::operator_cast_to_bool(&local_60);
  if (bVar1) {
    cmValue::operator->[abi_cxx11_(&local_60);
    __nptr = (char *)std::__cxx11::string::c_str();
    iVar2 = atoi(__nptr);
    this_local._7_1_ = iVar2 == 4;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool cmMakefile::PlatformIs32Bit() const
{
  if (cmValue plat_abi = this->GetDefinition("CMAKE_INTERNAL_PLATFORM_ABI")) {
    if (*plat_abi == "ELF X32") {
      return false;
    }
  }
  if (cmValue sizeof_dptr = this->GetDefinition("CMAKE_SIZEOF_VOID_P")) {
    return atoi(sizeof_dptr->c_str()) == 4;
  }
  return false;
}